

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O2

void TestValueFunction(Arguments *args)

{
  byte bVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  tms timeStruct;
  JointPolicyPureVector jpol;
  ValueFunctionDecPOMDPDiscrete V;
  JESPExhaustivePlanner plan;
  Interface_ProblemToPolicyDiscretePure local_5a8 [808];
  ProblemDecTiger pu;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"TestValueFunction()");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"horizon=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  std::endl<char,std::char_traits<char>>(poVar2);
  ProblemDecTiger::ProblemDecTiger(&pu);
  JESPExhaustivePlanner::JESPExhaustivePlanner
            (&plan,4,(DecPOMDPDiscreteInterface *)
                     (&pu.super_DecPOMDPDiscrete + *(long *)(pu._0_8_ + -0x50)),
             (PlanningUnitMADPDiscreteParameters *)0x0);
  PlanningUnitDecPOMDPDiscrete::SetProblem((DecPOMDPDiscreteInterface *)&plan);
  MultiAgentDecisionProcessDiscrete::Print((MultiAgentDecisionProcessDiscrete *)&pu);
  PlanningUnitMADPDiscrete::Print();
  JointPolicyPureVector::JointPolicyPureVector(&jpol,local_5a8);
  if (args->testMode == false) {
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<(poVar2,"Press <enter> to start value (v0) calculation of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
    poVar2 = std::operator<<(poVar2," joint policies without caching.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::istream::get();
  }
  times((tms *)&timeStruct);
  iVar3 = 1000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    JPolComponent_VectorImplementation::RandomInitialization();
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (&V,(PlanningUnitDecPOMDPDiscrete *)&plan,(JointPolicyDiscretePure *)&jpol);
    ValueFunctionDecPOMDPDiscrete::CalculateV<false>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(&V);
  }
  times((tms *)&timeStruct);
  if (args->testMode == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"done in ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," clock ticks.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Now starting value (v0) calculation of ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
  poVar2 = std::operator<<(poVar2," joint policies with caching.");
  std::endl<char,std::char_traits<char>>(poVar2);
  times((tms *)&timeStruct);
  iVar3 = 1000;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    JPolComponent_VectorImplementation::RandomInitialization();
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (&V,(PlanningUnitDecPOMDPDiscrete *)&plan,(JointPolicyDiscretePure *)&jpol);
    ValueFunctionDecPOMDPDiscrete::CalculateV<true>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(&V);
  }
  times((tms *)&timeStruct);
  bVar1 = args->testMode;
  if ((bool)bVar1 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"done in ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," clock ticks.");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = args->testMode;
  }
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::istream::get();
  }
  JointPolicyPureVector::~JointPolicyPureVector(&jpol);
  JESPExhaustivePlanner::~JESPExhaustivePlanner(&plan);
  ProblemDecTiger::~ProblemDecTiger(&pu);
  return;
}

Assistant:

void TestValueFunction(const ArgumentHandlers::Arguments& args)
{
    cout << "-------------------"<<endl;
    cout << "TestValueFunction()"<<endl;
    cout << "-------------------"<<endl;
    int horizon = 4;
    cout << endl << "horizon="<< horizon <<endl;
    ProblemDecTiger pu;
    JESPExhaustivePlanner plan(horizon, &pu);
    plan.SetProblem(&pu);

    pu.Print();
    plan.Print();

    JointPolicyPureVector jpol(&plan);
    
    //ValueFunctionDecPOMDPDiscrete Vtest(plan, jpol);
    //Vtest.Test();

    //the time structure...
    tms timeStruct;
    

    int nrLoops = 1000;
    if (!args.testMode)
    {
        cout << endl <<"Press <enter> to start value (v0) calculation of "<<nrLoops
             <<" joint policies without caching."<<endl;
        cin.get();
    }

    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<false>();
    }
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;
    cout << "Now starting value (v0) calculation of "<<nrLoops<<
        " joint policies with caching."<<endl;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<true>();
    }    
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
}